

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::TanHParameter::SerializeWithCachedSizes(TanHParameter *this,CodedOutputStream *output)

{
  void *pvVar1;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->engine_,output);
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void TanHParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.TanHParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.TanHParameter.Engine engine = 1 [default = DEFAULT];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->engine(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.TanHParameter)
}